

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdhopt.c
# Opt level: O2

int mbedtls_ecdhopt_use_static_key
              (mbedtls_ecdhopt_context *octx,mbedtls_ecp_keypair *key,mbedtls_ecdhopt_side side)

{
  int iVar1;
  size_t olen;
  mbedtls_ecdhopt_x25519_context ctx;
  
  if ((key->grp).id != MBEDTLS_ECP_DP_CURVE25519) {
    iVar1 = mbedtls_ecdh_get_params(&(octx->ctx).ec,key,side);
    return iVar1;
  }
  olen = 0;
  ctx.our_secret._0_8_ = *(undefined8 *)&octx->ctx;
  ctx.our_secret._8_8_ = *(undefined8 *)((long)&octx->ctx + 8);
  ctx.our_secret._16_8_ = *(undefined8 *)((long)&octx->ctx + 0x10);
  ctx.our_secret._24_8_ = *(undefined8 *)((long)&octx->ctx + 0x18);
  ctx.peer_point._0_8_ = *(undefined8 *)((long)&octx->ctx + 0x20);
  ctx.peer_point._8_8_ = *(undefined8 *)((long)&octx->ctx + 0x28);
  ctx.peer_point._16_8_ = *(undefined8 *)((long)&octx->ctx + 0x30);
  ctx.peer_point._24_8_ = *(undefined8 *)((long)&octx->ctx + 0x38);
  octx->curve = MBEDTLS_ECP_DP_CURVE25519;
  if (side == MBEDTLS_ECDH_OURS) {
    mbedtls_mpi_write_binary(&key->d,ctx.our_secret,0x20);
  }
  else {
    if (side != MBEDTLS_ECDH_THEIRS) {
      return -0x4f80;
    }
    mbedtls_ecp_point_write_binary(&key->grp,&key->Q,1,&olen,ctx.peer_point,0x20);
  }
  return -0x4e80;
}

Assistant:

int mbedtls_ecdhopt_use_static_key( mbedtls_ecdhopt_context *octx,
                      const mbedtls_ecp_keypair *key, mbedtls_ecdhopt_side side )
{
    if( key->grp.id == MBEDTLS_ECP_DP_CURVE25519 )
    {
        size_t olen = 0;
        mbedtls_ecdhopt_x25519_context ctx = octx->ctx.x25519;
        octx->curve = MBEDTLS_ECP_DP_CURVE25519;

        switch( side ) {
        case MBEDTLS_ECDH_THEIRS:
            mbedtls_ecp_point_write_binary( &key->grp, &key->Q, MBEDTLS_ECP_PF_COMPRESSED, &olen, ctx.peer_point, 32 );
            // untested; defensively throw an error for now.
            return(MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE);
        case MBEDTLS_ECDH_OURS:
            mbedtls_mpi_write_binary( &key->d, ctx.our_secret, 32 );
            // key->Q = key->d * base; do we need to set up ctx.peer_point here?
            // untested; defensively throw an error for now.
            return( MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE );
        default:
            return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );
        }
    }
    else
    {
        return mbedtls_ecdh_get_params( &octx->ctx.ec, key, side );
    }
}